

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_name_contains_word_(char *name,char *pattern)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  bool bVar4;
  int ends_on_word_boundary;
  int starts_on_word_boundary;
  size_t pattern_len;
  char *substr;
  char *local_20;
  
  sVar1 = strlen(in_RSI);
  local_20 = strstr(in_RDI,in_RSI);
  while( true ) {
    if (local_20 == (char *)0x0) {
      return 0;
    }
    bVar3 = true;
    if (local_20 != in_RDI) {
      pcVar2 = strchr(" \t-_/.,:;",(int)local_20[-1]);
      bVar3 = pcVar2 != (char *)0x0;
    }
    bVar4 = true;
    if (local_20[sVar1] != '\0') {
      pcVar2 = strchr(" \t-_/.,:;",(int)local_20[sVar1]);
      bVar4 = pcVar2 != (char *)0x0;
    }
    if ((bVar3) && (bVar4)) break;
    local_20 = strstr(local_20 + 1,in_RSI);
  }
  return 1;
}

Assistant:

static int
acutest_name_contains_word_(const char* name, const char* pattern)
{
    static const char word_delim[] = " \t-_/.,:;";
    const char* substr;
    size_t pattern_len;

    pattern_len = strlen(pattern);

    substr = strstr(name, pattern);
    while(substr != NULL) {
        int starts_on_word_boundary = (substr == name || strchr(word_delim, substr[-1]) != NULL);
        int ends_on_word_boundary = (substr[pattern_len] == '\0' || strchr(word_delim, substr[pattern_len]) != NULL);

        if(starts_on_word_boundary && ends_on_word_boundary)
            return 1;

        substr = strstr(substr+1, pattern);
    }

    return 0;
}